

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O0

bool __thiscall SceneRender::loadScene(SceneRender *this,Uniforms *_uniforms)

{
  bool bVar1;
  pointer ppVar2;
  string *_text;
  BoundingBox *_b;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
  *this_00;
  mapped_type *ppLVar3;
  DefaultShaders _type;
  DefaultShaders _type_00;
  DefaultShaders _type_01;
  DefaultShaders _type_02;
  float fVar4;
  float y;
  string local_260;
  string local_240;
  allocator local_219;
  key_type local_218;
  allocator local_1f1;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_61;
  string local_60;
  _Self local_40;
  _Self local_38;
  iterator it;
  BoundingBox bbox;
  Uniforms *_uniforms_local;
  SceneRender *this_local;
  
  bbox.max._4_8_ = _uniforms;
  vera::cleanLabels();
  vera::BoundingBox::BoundingBox((BoundingBox *)&it);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
                *)(bbox.max._4_8_ + 0x128));
  while( true ) {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
                *)(bbox.max._4_8_ + 0x128));
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
             ::operator->(&local_38);
    _text = vera::Model::getName_abi_cxx11_(ppVar2->second);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
             ::operator->(&local_38);
    vera::addLabel(_text,ppVar2->second,LABEL_RIGHT,0.0);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
             ::operator->(&local_38);
    _b = vera::Model::getBoundingBox(ppVar2->second);
    vera::BoundingBox::expand((BoundingBox *)&it,_b);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
    ::operator++(&local_38);
  }
  fVar4 = glm::length<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)&it);
  y = glm::length<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)&bbox.min.field_1);
  fVar4 = glm::max<float>(fVar4,y);
  fVar4 = glm::max<float>(0.5,fVar4);
  this->m_area = fVar4;
  this->m_floor_height = it._M_node._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"FLOOR",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"",&local_99);
  vera::Model::addDefine(&this->m_floor,&local_60,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"MODEL_VERTEX_COLOR",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"v_color",&local_e9);
  vera::Model::addDefine(&this->m_floor,&local_c0,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"MODEL_VERTEX_NORMAL",&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"v_normal",&local_139);
  vera::Model::addDefine(&this->m_floor,&local_110,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"MODEL_VERTEX_TEXCOORD",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"v_texcoord",&local_189);
  vera::Model::addDefine(&this->m_floor,&local_160,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  vera::getDefaultSrc_abi_cxx11_(&local_1b0,(vera *)0x9,_type);
  vera::getDefaultSrc_abi_cxx11_(&local_1d0,(vera *)0x8,_type_00);
  vera::Shader::setSource(&this->m_cubemap_shader,&local_1b0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"u_light",&local_1f1);
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
             *)(bbox.max._4_8_ + 200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"default",&local_219);
  ppLVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
            ::operator[](this_00,&local_218);
  vera::addLabel(&local_1f0,&(*ppLVar3)->super_Node,LABEL_DOWN,30.0);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  vera::getDefaultSrc_abi_cxx11_(&local_240,(vera *)0xd,_type_01);
  vera::getDefaultSrc_abi_cxx11_(&local_260,(vera *)0xc,_type_02);
  vera::Shader::setSource(&this->m_lightUI_shader,&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  return true;
}

Assistant:

bool SceneRender::loadScene(Uniforms& _uniforms) {
    vera::cleanLabels();

    // Calculate the total area
    vera::BoundingBox bbox;
    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
        vera::addLabel( it->second->getName(), it->second, vera::LABEL_RIGHT);
        bbox.expand( it->second->getBoundingBox() );
    }

    m_area = glm::max(0.5f, glm::max(glm::length(bbox.min), glm::length(bbox.max)));
    
    // Floor
    m_floor_height = bbox.min.y;
    m_floor.addDefine("FLOOR");
    m_floor.addDefine("MODEL_VERTEX_COLOR", "v_color");
    m_floor.addDefine("MODEL_VERTEX_NORMAL", "v_normal");
    m_floor.addDefine("MODEL_VERTEX_TEXCOORD","v_texcoord");
    // m_floor.setShader(vera::getDefaultSrc(vera::FRAG_DEFAULT_SCENE), vera::getDefaultSrc(vera::VERT_DEFAULT_SCENE));

    // Cubemap
    m_cubemap_shader.setSource(vera::getDefaultSrc(vera::FRAG_CUBEMAP), vera::getDefaultSrc(vera::VERT_CUBEMAP));

    // Light
    vera::addLabel("u_light", _uniforms.lights["default"], vera::LABEL_DOWN, 30.0f);
    m_lightUI_shader.setSource(vera::getDefaultSrc(vera::FRAG_LIGHT), vera::getDefaultSrc(vera::VERT_LIGHT));

    return true;
}